

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,wstring *wideString)

{
  long lVar1;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  output;
  wstring *wideString_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  lVar1 = std::__cxx11::wstring::length();
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(&this->mString,lVar1 + 1);
  begin._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  end._M_current = (wchar_t *)std::__cxx11::wstring::end();
  output = std::back_inserter<std::__cxx11::u32string>(&this->mString);
  Utf<32u>::
  FromWide<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,end,output);
  return;
}

Assistant:

String::String( const std::wstring& wideString ) {
	mString.reserve( wideString.length() + 1 );
	Utf32::FromWide( wideString.begin(), wideString.end(), std::back_inserter( mString ) );
}